

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qclipboard.cpp
# Opt level: O1

QString * __thiscall
QClipboard::text(QString *__return_storage_ptr__,QClipboard *this,QString *subtype,Mode mode)

{
  Interface *pIVar1;
  char16_t *pcVar2;
  QString *pQVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  qsizetype qVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  QLatin1String QVar12;
  QByteArrayView QVar13;
  QByteArrayView in;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QStringBuilder<QLatin1String,_QString_&> local_d0;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  undefined1 local_78 [8];
  char16_t *pcStack_70;
  QString *pQStack_68;
  qsizetype local_60;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_58;
  ClearDataFn p_Stack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xe])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  cVar4 = (**(code **)(*plVar6 + 0x20))(plVar6,mode);
  if (cVar4 == '\0') {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6,mode);
  }
  if (plVar6 == (long *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_002becc9;
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d._0_4_ = 0xaaaaaaaa;
  local_98.d._4_4_ = 0xaaaaaaaa;
  local_98.ptr._0_4_ = 0xaaaaaaaa;
  local_98.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*plVar6 + 0x68))(&local_98,plVar6);
  if ((subtype->d).size == 0) {
    QVar14.m_data = "text/plain";
    QVar14.m_size = 10;
    cVar4 = QtPrivate::QStringList_contains((QList_conflict *)&local_98,QVar14,CaseSensitive);
    if (cVar4 == '\0') {
      if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
        lVar11 = CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
        lVar10 = local_98.size * 0x18;
        do {
          QVar12.m_data = &DAT_00000005;
          QVar12.m_size = lVar11;
          cVar4 = QString::startsWith(QVar12,0x68e96b);
          if (cVar4 != '\0') {
            QString::QString((QString *)local_78,(QChar *)(*(long *)(lVar11 + 8) + 10),
                             *(long *)(lVar11 + 0x10) + -5);
            pIVar1 = (Interface *)(subtype->d).d;
            pcVar2 = (subtype->d).ptr;
            (subtype->d).d = (Data *)local_78;
            (subtype->d).ptr = pcStack_70;
            pQVar3 = (QString *)(subtype->d).size;
            (subtype->d).size = (qsizetype)pQStack_68;
            local_78 = (undefined1  [8])pIVar1;
            pcStack_70 = pcVar2;
            pQStack_68 = pQVar3;
            if (pIVar1 != (Interface *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&pIVar1->name)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&pIVar1->name)->_q_value).super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if ((((QBasicAtomicInt *)&pIVar1->name)->_q_value).super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)pIVar1,2,0x10);
              }
            }
            break;
          }
          lVar11 = lVar11 + 0x18;
          lVar10 = lVar10 + -0x18;
        } while (lVar10 != 0);
      }
      if ((subtype->d).size == 0) goto LAB_002bec84;
    }
    else {
      QVar15.m_data = "plain";
      QVar15.m_size = 5;
      QString::operator=(subtype,QVar15);
    }
LAB_002beb7d:
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_d0.a.m_size = 5;
    local_d0.a.m_data = "text/";
    local_d0.b = subtype;
    QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>((QString *)local_78,&local_d0);
    QMimeData::data(&local_b8);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    QVar13.m_data = (storage_type *)local_b8.d.ptr;
    QVar13.m_size = local_b8.d.size;
    uVar8 = QStringConverter::encodingForData(QVar13,L'\0');
    uVar9 = 0;
    if ((uVar8 >> 0x20 & 1) != 0) {
      uVar9 = uVar8 & 0xffffffff;
    }
    local_78 = (undefined1  [8])(&QStringConverter::encodingInterfaces + uVar9 * 5);
    pcStack_70 = (char16_t *)0x0;
    pQStack_68 = (QString *)0x0;
    local_60 = 0;
    aStack_58.d[0] = (void *)0x0;
    aStack_58.d[1] = (void *)0x0;
    p_Stack_48 = (ClearDataFn)0x0;
    in.m_data = (storage_type *)local_b8.d.ptr;
    in.m_size = local_b8.d.size;
    QStringDecoder::decodeAsString(__return_storage_ptr__,(QStringDecoder *)local_78,in);
    QStringConverterBase::State::clear();
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    local_78 = (undefined1  [8])&DAT_00000005;
    pcStack_70 = L"text/";
    pQStack_68 = subtype;
    qVar7 = QtPrivate::indexOf<QString,QStringBuilder<QLatin1String,QString&>>
                      ((QList<QString> *)&local_98,
                       (QStringBuilder<QLatin1String,_QString_&> *)local_78,0);
    if (qVar7 != -1) goto LAB_002beb7d;
LAB_002bec84:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002becc9:
  __stack_chk_fail();
}

Assistant:

QString QClipboard::text(QString &subtype, Mode mode) const
{
    const QMimeData *const data = mimeData(mode);
    if (!data)
        return QString();

    const QStringList formats = data->formats();
    if (subtype.isEmpty()) {
        if (formats.contains("text/plain"_L1))
            subtype = "plain"_L1;
        else {
            for (const auto &format : formats) {
                if (format.startsWith("text/"_L1)) {
                    subtype = format.sliced(5);
                    break;
                }
            }
            if (subtype.isEmpty())
                return QString();
        }
    } else if (!formats.contains("text/"_L1 + subtype)) {
        return QString();
    }

    const QByteArray rawData = data->data("text/"_L1 + subtype);
    auto encoding = QStringConverter::encodingForData(rawData);
    if (!encoding)
        encoding = QStringConverter::Utf8;
    return QStringDecoder(*encoding).decode(rawData);
}